

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O3

bool __thiscall
slang::ast::Bitstream::checkClassAccess
          (Bitstream *this,Type *type,ASTContext *context,SourceRange sourceRange)

{
  bool bVar1;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> symbol;
  Diagnostic *diag;
  int *piVar2;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar3;
  SourceRange sourceRange_00;
  
  sourceRange_00.endLoc = sourceRange.startLoc;
  piVar2 = *(int **)(this + 0x40);
  if (piVar2 == (int *)0x0) {
    Type::resolveCanonical((Type *)this);
    piVar2 = *(int **)(this + 0x40);
  }
  if (*piVar2 == 0x16) {
    sVar3 = Scope::membersOfType<slang::ast::ClassPropertySymbol>((Scope *)(piVar2 + 0x12));
    symbol = sVar3._M_begin.current;
joined_r0x0027b0be:
    if (symbol.current != sVar3._M_end.current.current) {
      if (((*(int *)&symbol.current[5].location != 0) &&
          (*(int *)&symbol.current[5].name._M_str == 0)) &&
         (bVar1 = Lookup::isVisibleFrom(symbol.current,*(Scope **)&type->super_Symbol), !bVar1)) {
        sourceRange_00.startLoc = (SourceLocation)context;
        diag = ASTContext::addDiag((ASTContext *)type,(DiagCode)0x3d0007,sourceRange_00);
        ast::operator<<(diag,(Type *)this);
        return false;
      }
      do {
        symbol.current = (symbol.current)->nextInScope;
        if (symbol.current == (Symbol *)0x0) {
          symbol.current = (Symbol *)0x0;
          break;
        }
      } while ((symbol.current)->kind != ClassProperty);
      goto joined_r0x0027b0be;
    }
  }
  return true;
}

Assistant:

bool Bitstream::checkClassAccess(const Type& type, const ASTContext& context,
                                 SourceRange sourceRange) {
    if (!type.isClass())
        return true;

    auto& ct = type.getCanonicalType().as<ClassType>();
    for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
        if (prop.visibility != Visibility::Public && prop.lifetime == VariableLifetime::Automatic) {
            if (!Lookup::isVisibleFrom(prop, *context.scope)) {
                context.addDiag(diag::ClassPrivateMembersBitstream, sourceRange) << type;
                return false;
            }
        }
    }
    return true;
}